

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr
          (RefPtr<wabt::interp::Extern> *this,Store *store,Ref ref)

{
  ObjectKind OVar1;
  Object *pOVar2;
  Index IVar3;
  _Map_pointer ppEVar4;
  ReadBinaryOptions *in_RCX;
  size_t size;
  ReadBinaryOptions *this_00;
  BinaryReaderIR BStack_f0;
  size_t sStack_48;
  
  pOVar2 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar2 & 1) == 0) {
    OVar1 = pOVar2->kind_;
    if (5 < OVar1 - DefinedFunc) {
      in_RCX = (ReadBinaryOptions *)0x0;
      this_00 = (ReadBinaryOptions *)(ulong)OVar1;
      if (ref.index == 0) {
        this_00 = in_RCX;
      }
LAB_0012f3bd:
      interp::RefPtr((interp *)this_00);
      BStack_f0.super_BinaryReaderNop.super_BinaryReaderDelegate.state = (State *)0x0;
      BStack_f0.super_BinaryReaderNop.super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
           (_func_int **)&PTR__BinaryReaderIR_001dcce0;
      BStack_f0.current_func_ = (Func *)0x0;
      BStack_f0.label_stack_.
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      BStack_f0.label_stack_.
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      BStack_f0.label_stack_.
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      BStack_f0.code_metadata_queue_.entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_map_size = 8;
      BStack_f0.filename_ = (char *)this_00;
      sStack_48 = ref.index;
      ppEVar4 = (_Map_pointer)operator_new(0x40);
      BStack_f0.code_metadata_queue_.entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_map = ppEVar4;
      BStack_f0.code_metadata_queue_.entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)operator_new(0x1b8);
      ppEVar4[3] = BStack_f0.code_metadata_queue_.entries.
                   super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
      BStack_f0.code_metadata_queue_.entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_last =
           BStack_f0.code_metadata_queue_.entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur + 5;
      BStack_f0.current_metadata_name_._M_len = 0;
      BStack_f0.current_metadata_name_._M_str = (char *)0x0;
      BStack_f0.code_metadata_queue_.entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first =
           BStack_f0.code_metadata_queue_.entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
      BStack_f0.code_metadata_queue_.entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node = ppEVar4 + 3;
      BStack_f0.code_metadata_queue_.entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur =
           BStack_f0.code_metadata_queue_.entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
      BStack_f0.code_metadata_queue_.entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first =
           BStack_f0.code_metadata_queue_.entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
      BStack_f0.code_metadata_queue_.entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last =
           BStack_f0.code_metadata_queue_.entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
      BStack_f0.code_metadata_queue_.entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = ppEVar4 + 3;
      ReadBinary(store,size,(BinaryReaderDelegate *)&BStack_f0,in_RCX);
      anon_unknown_15::BinaryReaderIR::~BinaryReaderIR(&BStack_f0);
      return;
    }
    IVar3 = Store::NewRoot(store,ref);
    this->root_index_ = IVar3;
    pOVar2 = (store->objects_).list_.
             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
             _M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pOVar2 & 1) == 0) {
      this->obj_ = (Extern *)pOVar2;
      this->store_ = store;
      return;
    }
  }
  else {
    this_00 = (ReadBinaryOptions *)0x0;
    if (ref.index == 0) goto LAB_0012f3bd;
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe6,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}